

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan_sse41_128_32.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_table_scan_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  int *piVar1;
  uint *puVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  parasail_result_t *ppVar12;
  __m128i *ptr;
  int32_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  ulong size;
  ulong uVar13;
  __m128i *palVar14;
  __m128i *palVar15;
  char *pcVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  int32_t iVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  ulong uVar24;
  char *__format;
  long lVar25;
  int iVar26;
  int iVar27;
  int32_t segNum;
  long lVar28;
  long lVar29;
  int iVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  __m128i alVar38;
  int iVar42;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  int iVar44;
  int iVar45;
  uint uVar47;
  int iVar48;
  int iVar49;
  uint uVar50;
  int iVar51;
  int iVar52;
  uint uVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  undefined1 auVar46 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  uint uVar66;
  int iVar67;
  uint uVar68;
  int iVar69;
  uint uVar70;
  int iVar71;
  uint uVar72;
  int local_d0;
  long local_a0;
  __m128i_32_t e;
  __m128i_32_t h;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar16 = "profile";
  }
  else {
    pvVar4 = (profile->profile32).score;
    if (pvVar4 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar16 = "profile->profile32.score";
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar16 = "profile->matrix";
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar16 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar16 = "s2";
        }
        else {
          uVar24 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            __format = "%s: %s must be > 0\n";
            pcVar16 = "s2Len";
          }
          else if (open < 0) {
            __format = "%s: %s must be >= 0\n";
            pcVar16 = "open";
          }
          else {
            if (-1 < gap) {
              uVar10 = uVar3 - 1;
              size = (ulong)uVar3 + 3 >> 2;
              iVar30 = -open;
              iVar26 = ppVar5->min;
              uVar18 = 0x80000000 - iVar26;
              if (iVar26 != iVar30 && SBORROW4(iVar26,iVar30) == iVar26 + open < 0) {
                uVar18 = open | 0x80000000;
              }
              uVar11 = 0x7ffffffe - ppVar5->max;
              ppVar12 = parasail_result_new_table1((uint)((ulong)uVar3 + 3) & 0x7ffffffc,s2Len);
              if (ppVar12 != (parasail_result_t *)0x0) {
                ppVar12->flag =
                     (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 |
                     (uint)(s2_beg != 0) << 0xe | (uint)(s2_end != 0) << 0xf | ppVar12->flag |
                     0x4420402;
                ptr = parasail_memalign___m128i(0x10,size);
                ptr_00 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
                ptr_01 = parasail_memalign___m128i(0x10,size);
                ptr_02 = parasail_memalign___m128i(0x10,size);
                ptr_03 = parasail_memalign___m128i(0x10,size);
                uVar13 = 0;
                if (ptr_03 != (__m128i *)0x0 &&
                    ((ptr_02 != (__m128i *)0x0 && ptr_01 != (__m128i *)0x0) &&
                    (ptr_00 != (int32_t *)0x0 && ptr != (__m128i *)0x0))) {
                  iVar17 = s2Len + -1;
                  iVar22 = 3 - (int)(uVar10 / size);
                  uVar18 = uVar18 + 1;
                  auVar32._4_4_ = uVar18;
                  auVar32._0_4_ = uVar18;
                  auVar32._8_4_ = uVar18;
                  auVar32._12_4_ = uVar18;
                  uVar19 = (uint)size;
                  iVar23 = -(uVar19 * gap);
                  iVar26 = iVar30;
                  for (; uVar13 != size; uVar13 = uVar13 + 1) {
                    iVar27 = iVar26;
                    for (lVar28 = 0; lVar28 != 4; lVar28 = lVar28 + 1) {
                      iVar42 = 0;
                      if (s1_beg == 0) {
                        iVar42 = iVar27;
                      }
                      *(int *)((long)&h + lVar28 * 4) = iVar42;
                      lVar29 = (long)iVar42 - (ulong)(uint)open;
                      if (lVar29 < -0x7fffffff) {
                        lVar29 = -0x80000000;
                      }
                      *(int *)((long)&e + lVar28 * 4) = (int)lVar29;
                      iVar27 = iVar27 - uVar19 * gap;
                    }
                    ptr_02[uVar13][0] = h.m[0];
                    ptr_02[uVar13][1] = h.m[1];
                    ptr[uVar13][0] = e.m[0];
                    ptr[uVar13][1] = e.m[1];
                    iVar26 = iVar26 - gap;
                  }
                  *ptr_00 = 0;
                  for (uVar13 = 1; s2Len + 1 != uVar13; uVar13 = uVar13 + 1) {
                    iVar20 = 0;
                    if (s2_beg == 0) {
                      iVar20 = iVar30;
                    }
                    ptr_00[uVar13] = iVar20;
                    iVar30 = iVar30 - gap;
                  }
                  iVar26 = -open;
                  iVar30 = -open;
                  iVar27 = -open;
                  iVar42 = -open;
                  uVar34 = uVar11;
                  uVar35 = uVar11;
                  uVar36 = uVar11;
                  uVar37 = uVar11;
                  for (uVar21 = uVar19 - 1; -1 < (int)uVar21; uVar21 = uVar21 - 1) {
                    palVar14 = ptr_03 + uVar21;
                    *(int *)*palVar14 = iVar26;
                    *(int *)((long)*palVar14 + 4) = iVar30;
                    *(int *)(*palVar14 + 1) = iVar27;
                    *(int *)((long)*palVar14 + 0xc) = iVar42;
                    iVar26 = iVar26 - gap;
                    iVar30 = iVar30 - gap;
                    iVar27 = iVar27 - gap;
                    iVar42 = iVar42 - gap;
                    uVar34 = (uint)(iVar26 < (int)uVar34) * iVar26 |
                             (iVar26 >= (int)uVar34) * uVar34;
                    uVar35 = (uint)(iVar30 < (int)uVar35) * iVar30 |
                             (iVar30 >= (int)uVar35) * uVar35;
                    uVar36 = (uint)(iVar27 < (int)uVar36) * iVar27 |
                             (iVar27 >= (int)uVar36) * uVar36;
                    uVar37 = (uint)(iVar42 < (int)uVar37) * iVar42 |
                             (iVar42 >= (int)uVar37) * uVar37;
                  }
                  palVar14 = ptr_02 + (uVar19 - 1);
                  palVar15 = ptr_02 + (ulong)uVar10 % size;
                  lVar28 = size * uVar24;
                  local_a0 = 0;
                  uVar13 = 0;
                  auVar39 = auVar32;
                  auVar43 = auVar32;
                  local_d0 = iVar17;
                  while (uVar13 != uVar24) {
                    iVar26 = ppVar5->mapper[(byte)s2[uVar13]];
                    uVar21 = uVar18 - (int)(*ptr_03)[0];
                    uVar47 = uVar18 - *(int *)((long)*ptr_03 + 4);
                    uVar50 = uVar18 - (int)(*ptr_03)[1];
                    uVar53 = uVar18 - *(int *)((long)*ptr_03 + 0xc);
                    lVar29 = 0;
                    auVar58 = auVar32;
                    iVar20 = ptr_00[uVar13];
                    iVar30 = (int)(*palVar14)[0];
                    iVar27 = *(int *)((long)*palVar14 + 4);
                    iVar42 = (int)(*palVar14)[1];
                    while( true ) {
                      iVar56 = auVar58._0_4_;
                      iVar49 = auVar58._4_4_;
                      iVar52 = auVar58._8_4_;
                      iVar57 = auVar58._12_4_;
                      if (size << 4 == lVar29) break;
                      piVar1 = (int *)((long)*ptr_02 + lVar29);
                      iVar55 = *piVar1;
                      iVar7 = piVar1[1];
                      iVar8 = piVar1[2];
                      iVar9 = piVar1[3];
                      piVar1 = (int *)((long)*ptr + lVar29);
                      iVar61 = *piVar1 - gap;
                      iVar62 = piVar1[1] - gap;
                      iVar63 = piVar1[2] - gap;
                      iVar64 = piVar1[3] - gap;
                      iVar65 = iVar55 - open;
                      iVar67 = iVar7 - open;
                      iVar69 = iVar8 - open;
                      iVar71 = iVar9 - open;
                      piVar1 = (int *)((long)pvVar4 + lVar29 + (long)(int)(iVar26 * uVar19) * 0x10);
                      iVar44 = iVar20 + *piVar1;
                      iVar30 = iVar30 + piVar1[1];
                      iVar27 = iVar27 + piVar1[2];
                      iVar42 = iVar42 + piVar1[3];
                      piVar1 = (int *)((long)*ptr_03 + lVar29);
                      iVar45 = uVar21 + *piVar1;
                      iVar48 = uVar47 + piVar1[1];
                      iVar51 = uVar50 + piVar1[2];
                      iVar54 = uVar53 + piVar1[3];
                      uVar66 = (uint)(iVar65 < iVar61) * iVar61 | (uint)(iVar65 >= iVar61) * iVar65;
                      uVar68 = (uint)(iVar67 < iVar62) * iVar62 | (uint)(iVar67 >= iVar62) * iVar67;
                      uVar70 = (uint)(iVar69 < iVar63) * iVar63 | (uint)(iVar69 >= iVar63) * iVar69;
                      uVar72 = (uint)(iVar71 < iVar64) * iVar64 | (uint)(iVar71 >= iVar64) * iVar71;
                      auVar58._0_4_ =
                           (uint)(iVar56 < iVar45) * iVar45 | (uint)(iVar56 >= iVar45) * iVar56;
                      auVar58._4_4_ =
                           (uint)(iVar49 < iVar48) * iVar48 | (uint)(iVar49 >= iVar48) * iVar49;
                      auVar58._8_4_ =
                           (uint)(iVar52 < iVar51) * iVar51 | (uint)(iVar52 >= iVar51) * iVar52;
                      auVar58._12_4_ =
                           (uint)(iVar57 < iVar54) * iVar54 | (uint)(iVar57 >= iVar54) * iVar57;
                      uVar21 = (iVar44 < (int)uVar66) * uVar66 |
                               (uint)(iVar44 >= (int)uVar66) * iVar44;
                      uVar47 = (iVar30 < (int)uVar68) * uVar68 |
                               (uint)(iVar30 >= (int)uVar68) * iVar30;
                      uVar50 = (iVar27 < (int)uVar70) * uVar70 |
                               (uint)(iVar27 >= (int)uVar70) * iVar27;
                      uVar53 = (iVar42 < (int)uVar72) * uVar72 |
                               (uint)(iVar42 >= (int)uVar72) * iVar42;
                      puVar2 = (uint *)((long)*ptr + lVar29);
                      *puVar2 = uVar66;
                      puVar2[1] = uVar68;
                      puVar2[2] = uVar70;
                      puVar2[3] = uVar72;
                      puVar2 = (uint *)((long)*ptr_01 + lVar29);
                      *puVar2 = uVar21;
                      puVar2[1] = uVar47;
                      puVar2[2] = uVar50;
                      puVar2[3] = uVar53;
                      lVar29 = lVar29 + 0x10;
                      iVar20 = iVar55;
                      iVar30 = iVar7;
                      iVar27 = iVar8;
                      iVar42 = iVar9;
                    }
                    iVar26 = ptr_00[uVar13 + 1];
                    iVar30 = (int)(*ptr_03)[0] + iVar26;
                    iVar27 = *(int *)((long)*ptr_03 + 4) + uVar21;
                    iVar42 = (int)(*ptr_03)[1] + uVar47;
                    iVar55 = *(int *)((long)*ptr_03 + 0xc) + uVar50;
                    auVar59._0_4_ =
                         (uint)(iVar56 < iVar30) * iVar30 | (uint)(iVar56 >= iVar30) * iVar56;
                    auVar59._4_4_ =
                         (uint)(iVar49 < iVar27) * iVar27 | (uint)(iVar49 >= iVar27) * iVar49;
                    auVar59._8_4_ =
                         (uint)(iVar52 < iVar42) * iVar42 | (uint)(iVar52 >= iVar42) * iVar52;
                    auVar59._12_4_ =
                         (uint)(iVar57 < iVar55) * iVar55 | (uint)(iVar57 >= iVar55) * iVar57;
                    iVar30 = 2;
                    while( true ) {
                      bVar31 = iVar30 == 0;
                      iVar30 = iVar30 + -1;
                      uVar53 = auVar59._0_4_;
                      uVar66 = auVar59._4_4_;
                      uVar68 = auVar59._8_4_;
                      if (bVar31) break;
                      iVar27 = uVar53 + iVar23;
                      iVar42 = uVar66 + iVar23;
                      iVar56 = uVar68 + iVar23;
                      auVar60._0_4_ =
                           ((int)uVar53 < (int)uVar18) * uVar18 |
                           ((int)uVar53 >= (int)uVar18) * uVar53;
                      auVar60._4_4_ =
                           (uint)((int)uVar66 < iVar27) * iVar27 | ((int)uVar66 >= iVar27) * uVar66;
                      iVar27 = auVar59._12_4_;
                      auVar60._8_4_ =
                           (uint)((int)uVar68 < iVar42) * iVar42 | ((int)uVar68 >= iVar42) * uVar68;
                      auVar60._12_4_ =
                           (uint)(iVar27 < iVar56) * iVar56 | (uint)(iVar27 >= iVar56) * iVar27;
                      auVar59 = auVar60;
                    }
                    uVar70 = (iVar26 < (int)uVar18) * uVar18 |
                             (uint)(iVar26 >= (int)uVar18) * iVar26;
                    uVar72 = ((int)uVar21 < (int)uVar53) * uVar53 |
                             ((int)uVar21 >= (int)uVar53) * uVar21;
                    uVar47 = ((int)uVar47 < (int)uVar66) * uVar66 |
                             ((int)uVar47 >= (int)uVar66) * uVar47;
                    uVar50 = ((int)uVar50 < (int)uVar68) * uVar68 |
                             ((int)uVar50 >= (int)uVar68) * uVar50;
                    lVar29 = local_a0;
                    uVar21 = uVar18;
                    for (lVar25 = 0; size << 4 != lVar25; lVar25 = lVar25 + 0x10) {
                      iVar56 = uVar21 - gap;
                      iVar49 = uVar53 - gap;
                      iVar52 = uVar66 - gap;
                      iVar57 = uVar68 - gap;
                      iVar26 = uVar70 - open;
                      iVar30 = uVar72 - open;
                      iVar27 = uVar47 - open;
                      iVar42 = uVar50 - open;
                      uVar21 = (uint)(iVar56 < iVar26) * iVar26 | (uint)(iVar56 >= iVar26) * iVar56;
                      uVar53 = (uint)(iVar49 < iVar30) * iVar30 | (uint)(iVar49 >= iVar30) * iVar49;
                      uVar66 = (uint)(iVar52 < iVar27) * iVar27 | (uint)(iVar52 >= iVar27) * iVar52;
                      uVar68 = (uint)(iVar57 < iVar42) * iVar42 | (uint)(iVar57 >= iVar42) * iVar57;
                      piVar1 = (int *)((long)*ptr_01 + lVar25);
                      iVar26 = *piVar1;
                      iVar30 = piVar1[1];
                      iVar27 = piVar1[2];
                      iVar42 = piVar1[3];
                      uVar70 = (iVar26 < (int)uVar21) * uVar21 |
                               (uint)(iVar26 >= (int)uVar21) * iVar26;
                      uVar72 = (iVar30 < (int)uVar53) * uVar53 |
                               (uint)(iVar30 >= (int)uVar53) * iVar30;
                      uVar47 = (iVar27 < (int)uVar66) * uVar66 |
                               (uint)(iVar27 >= (int)uVar66) * iVar27;
                      uVar50 = (iVar42 < (int)uVar68) * uVar68 |
                               (uint)(iVar42 >= (int)uVar68) * iVar42;
                      puVar2 = (uint *)((long)*ptr_02 + lVar25);
                      *puVar2 = uVar70;
                      puVar2[1] = uVar72;
                      puVar2[2] = uVar47;
                      puVar2[3] = uVar50;
                      uVar34 = ((int)uVar21 < (int)uVar34) * uVar21 |
                               ((int)uVar21 >= (int)uVar34) * uVar34;
                      uVar35 = ((int)uVar53 < (int)uVar35) * uVar53 |
                               ((int)uVar53 >= (int)uVar35) * uVar35;
                      uVar36 = ((int)uVar66 < (int)uVar36) * uVar66 |
                               ((int)uVar66 >= (int)uVar36) * uVar36;
                      uVar37 = ((int)uVar68 < (int)uVar37) * uVar68 |
                               ((int)uVar68 >= (int)uVar37) * uVar37;
                      piVar1 = ((ppVar12->field_4).rowcols)->score_row;
                      *(uint *)((long)piVar1 + lVar29) = uVar70;
                      *(uint *)((long)piVar1 + lVar28 * 4 + lVar29) = uVar72;
                      *(uint *)((long)piVar1 + lVar28 * 8 + lVar29) = uVar47;
                      *(uint *)((long)piVar1 + lVar28 * 0xc + lVar29) = uVar50;
                      uVar34 = ((int)uVar70 < (int)uVar34) * uVar70 |
                               ((int)uVar70 >= (int)uVar34) * uVar34;
                      uVar35 = ((int)uVar72 < (int)uVar35) * uVar72 |
                               ((int)uVar72 >= (int)uVar35) * uVar35;
                      uVar36 = ((int)uVar47 < (int)uVar36) * uVar47 |
                               ((int)uVar47 >= (int)uVar36) * uVar36;
                      uVar37 = ((int)uVar50 < (int)uVar37) * uVar50 |
                               ((int)uVar50 >= (int)uVar37) * uVar37;
                      iVar26 = auVar39._0_4_;
                      auVar40._0_4_ =
                           (iVar26 < (int)uVar70) * uVar70 | (uint)(iVar26 >= (int)uVar70) * iVar26;
                      iVar26 = auVar39._4_4_;
                      auVar40._4_4_ =
                           (iVar26 < (int)uVar72) * uVar72 | (uint)(iVar26 >= (int)uVar72) * iVar26;
                      iVar26 = auVar39._8_4_;
                      iVar30 = auVar39._12_4_;
                      auVar40._8_4_ =
                           (iVar26 < (int)uVar47) * uVar47 | (uint)(iVar26 >= (int)uVar47) * iVar26;
                      auVar40._12_4_ =
                           (iVar30 < (int)uVar50) * uVar50 | (uint)(iVar30 >= (int)uVar50) * iVar30;
                      lVar29 = lVar29 + uVar24 * 4;
                      auVar39 = auVar40;
                    }
                    iVar26 = (int)(*palVar15)[0];
                    iVar30 = *(int *)((long)*palVar15 + 4);
                    iVar27 = (int)(*palVar15)[1];
                    iVar42 = *(int *)((long)*palVar15 + 0xc);
                    iVar56 = auVar43._0_4_;
                    auVar46._0_4_ = -(uint)(iVar56 < iVar26);
                    iVar49 = auVar43._4_4_;
                    auVar46._4_4_ = -(uint)(iVar49 < iVar30);
                    iVar52 = auVar43._8_4_;
                    auVar46._8_4_ = -(uint)(iVar52 < iVar27);
                    iVar57 = auVar43._12_4_;
                    auVar46._12_4_ = -(uint)(iVar57 < iVar42);
                    auVar6._4_4_ = -(uint)(iVar22 == 2);
                    auVar6._0_4_ = -(uint)(iVar22 == 3);
                    auVar6._8_4_ = -(uint)(iVar22 == 1);
                    auVar6._12_4_ = -(uint)(iVar22 == 0);
                    auVar43._0_4_ =
                         (uint)(iVar56 < iVar26) * iVar26 | (uint)(iVar56 >= iVar26) * iVar56;
                    auVar43._4_4_ =
                         (uint)(iVar49 < iVar30) * iVar30 | (uint)(iVar49 >= iVar30) * iVar49;
                    auVar43._8_4_ =
                         (uint)(iVar52 < iVar27) * iVar27 | (uint)(iVar52 >= iVar27) * iVar52;
                    auVar43._12_4_ =
                         (uint)(iVar57 < iVar42) * iVar42 | (uint)(iVar57 >= iVar42) * iVar57;
                    iVar26 = movmskps((int)palVar15,auVar46 & auVar6);
                    if (iVar26 != 0) {
                      local_d0 = (int)uVar13;
                    }
                    local_a0 = local_a0 + 4;
                    uVar13 = uVar13 + 1;
                  }
                  uVar21 = uVar18;
                  if (s2_end != 0) {
                    iVar26 = 0;
                    while( true ) {
                      uVar24 = auVar43._0_8_;
                      lVar28 = auVar43._8_8_;
                      if (iVar22 <= iVar26) break;
                      auVar43._0_8_ = uVar24 << 0x20;
                      auVar43._8_8_ = lVar28 << 0x20 | uVar24 >> 0x20;
                      iVar26 = iVar26 + 1;
                    }
                    uVar21 = auVar43._12_4_;
                  }
                  uVar47 = uVar10;
                  if (s1_end != 0) {
                    for (uVar24 = 0; (uVar19 & 0x1fffffff) << 2 != (uint)uVar24; uVar24 = uVar24 + 1
                        ) {
                      uVar50 = ((uint)uVar24 & 3) * uVar19 + ((uint)(uVar24 >> 2) & 0x3fffffff);
                      uVar53 = uVar21;
                      iVar26 = local_d0;
                      uVar66 = uVar47;
                      if (((int)uVar50 < (int)uVar3) &&
                         (uVar68 = *(uint *)((long)*ptr_02 + uVar24 * 4), uVar53 = uVar68,
                         iVar26 = iVar17, uVar66 = uVar50, (int)uVar68 <= (int)uVar21)) {
                        if ((int)uVar47 <= (int)uVar50) {
                          uVar50 = uVar47;
                        }
                        uVar53 = uVar21;
                        iVar26 = local_d0;
                        uVar66 = uVar47;
                        if (local_d0 == iVar17 && uVar68 == uVar21) {
                          uVar66 = uVar50;
                        }
                      }
                      uVar47 = uVar66;
                      local_d0 = iVar26;
                      uVar21 = uVar53;
                    }
                  }
                  if (s2_end == 0 && s1_end == 0) {
                    alVar38 = *palVar15;
                    iVar26 = 0;
                    while( true ) {
                      uVar24 = alVar38[0];
                      lVar28 = alVar38[1];
                      if (iVar22 <= iVar26) break;
                      alVar38[0] = uVar24 << 0x20;
                      alVar38[1] = lVar28 << 0x20 | uVar24 >> 0x20;
                      iVar26 = iVar26 + 1;
                    }
                    uVar21 = alVar38[1]._4_4_;
                    local_d0 = iVar17;
                    uVar47 = uVar10;
                    s1_end = iVar22;
                  }
                  auVar33._0_4_ = -(uint)((int)uVar34 < (int)uVar18);
                  auVar33._4_4_ = -(uint)((int)uVar35 < (int)uVar18);
                  auVar33._8_4_ = -(uint)((int)uVar36 < (int)uVar18);
                  auVar33._12_4_ = -(uint)((int)uVar37 < (int)uVar18);
                  auVar41._0_4_ = -(uint)((int)uVar11 < auVar39._0_4_);
                  auVar41._4_4_ = -(uint)((int)uVar11 < auVar39._4_4_);
                  auVar41._8_4_ = -(uint)((int)uVar11 < auVar39._8_4_);
                  auVar41._12_4_ = -(uint)((int)uVar11 < auVar39._12_4_);
                  iVar26 = movmskps(s1_end,auVar41 | auVar33);
                  if (iVar26 != 0) {
                    *(byte *)&ppVar12->flag = (byte)ppVar12->flag | 0x40;
                    uVar21 = 0;
                    local_d0 = 0;
                    uVar47 = 0;
                  }
                  ppVar12->score = uVar21;
                  ppVar12->end_query = uVar47;
                  ppVar12->end_ref = local_d0;
                  parasail_free(ptr_03);
                  parasail_free(ptr_02);
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(ptr);
                  return ppVar12;
                }
              }
              return (parasail_result_t *)0x0;
            }
            __format = "%s: %s must be >= 0\n";
            pcVar16 = "gap";
          }
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_table_scan_profile_sse41_128_32",pcVar16);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int32_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi32(_mm_set1_epi32(position),
            _mm_set_epi32(0,1,2,3));
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi32(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi32(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_sub_epi32(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_sub_epi32(vGapper, vGapE);
            /* long queries and/or large penalties will break the pseudo prefix scan */
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vGapper);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 4);
        vHp = _mm_insert_epi32(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi32(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi32(
                    _mm_sub_epi32(vE, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vHp = _mm_add_epi32(vHp, vW);
            vF = _mm_max_epi32(vF, _mm_add_epi32(vHt, pvGapper[i]));
            vHt = _mm_max_epi32(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 4);
        vHt = _mm_insert_epi32(vHt, boundary[j+1], 0);
        vF = _mm_max_epi32(vF, _mm_add_epi32(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 4);
            vFt = _mm_add_epi32(vFt, vSegLenXgap);
            vF = _mm_max_epi32(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 4);
        vF = _mm_add_epi32(vF, vNegInfFront);
        vH = _mm_max_epi32(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi32(
                    _mm_sub_epi32(vF, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vH = _mm_max_epi32(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vF);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 

        /* extract vector containing last value from column */
        {
            __m128i vCompare;
            vH = _mm_load_si128(pvH + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi32(vH, vMaxH));
            vMaxH = _mm_max_epi32(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 4);
        }
        score = (int32_t) _mm_extract_epi32(vMaxH, 3);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int32_t *t = (int32_t*)pvH;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            score = (int32_t) _mm_extract_epi32 (vH, 3);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}